

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildcards.cpp
# Opt level: O2

int Wildcard::set(char **wildcard,char **test)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  byte bVar5;
  byte bVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  bool bVar11;
  
  pcVar10 = *wildcard;
  cVar1 = *pcVar10;
  bVar11 = true;
  uVar8 = 0;
  bVar5 = 0;
  uVar9 = 0;
  bVar6 = 0;
  if (cVar1 != '!') goto LAB_00233000;
  do {
    bVar5 = bVar6;
    uVar8 = uVar9;
    pcVar10 = pcVar10 + 1;
    *wildcard = pcVar10;
LAB_00233000:
    cVar2 = *pcVar10;
    if ((!bVar11) && (cVar2 == ']')) {
      uVar9 = (uint)(cVar1 == '!');
      if (uVar8 != uVar9) {
        *test = *test + 1;
      }
      return uVar8 ^ uVar9;
    }
    if (uVar8 == 0) {
      if (cVar2 == '-') {
        cVar3 = pcVar10[-1];
        cVar4 = pcVar10[1];
        if (!(bool)(~bVar5 & 1 | cVar4 == ']' | cVar4 <= cVar3)) {
          cVar2 = **test;
          bVar7 = cVar2 <= cVar4 && cVar3 <= cVar2;
          if (cVar2 <= cVar4 && cVar3 <= cVar2) {
            pcVar10 = pcVar10 + 1;
          }
          goto LAB_0023306b;
        }
      }
      bVar7 = cVar2 == **test;
    }
    else {
      bVar7 = true;
    }
LAB_0023306b:
    bVar11 = false;
    uVar9 = (uint)bVar7;
    bVar6 = 1;
  } while( true );
}

Assistant:

int Wildcard::set(const char** wildcard, const char** test) {
  int fit          = 0;
  int negation     = 0;
  int at_beginning = 1;

  if ('!' == **wildcard) {
    negation = 1;
    (*wildcard)++;
  }
  while ((']' != **wildcard) || (1 == at_beginning)) {
    if (0 == fit) {
      if (('-' == **wildcard) && ((*(*wildcard - 1)) < (*(*wildcard + 1))) &&
          (']' != *(*wildcard + 1)) && (0 == at_beginning)) {
        if (((**test) >= (*(*wildcard - 1))) &&
            ((**test) <= (*(*wildcard + 1)))) {
          fit = 1;
          (*wildcard)++;
        }
      } else if ((**wildcard) == (**test)) {
        fit = 1;
      }
    }
    (*wildcard)++;
    at_beginning = 0;
  }
  if (1 == negation) /* change from zero to one and vice versa */
    fit = 1 - fit;
  if (1 == fit) (*test)++;

  return (fit);
}